

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snake.cpp
# Opt level: O3

bool __thiscall Snake::SnakeCell(Snake *this,int x,int y)

{
  pointer pSVar1;
  pointer pSVar2;
  bool bVar3;
  
  if (((int)this->head_x != x) || (bVar3 = true, (int)this->head_y != y)) {
    pSVar2 = (this->body).super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>._M_impl.
             super__Vector_impl_data._M_start;
    pSVar1 = (this->body).super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pSVar2 == pSVar1) {
      return false;
    }
    do {
      bVar3 = pSVar2->y == y && pSVar2->x == x;
      if (bVar3) {
        return bVar3;
      }
      pSVar2 = pSVar2 + 1;
    } while (pSVar2 != pSVar1);
  }
  return bVar3;
}

Assistant:

bool Snake::SnakeCell(int x, int y) {
    if (x == static_cast<int>(head_x) && y == static_cast<int>(head_y)) {
        return true;
    }
    for (auto const &item : body) {
        if (x == item.x && y == item.y) {
            return true;
        }
    }
    return false;
}